

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O2

Var Js::Math::Abs(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  Var pvVar7;
  void *pvVar8;
  double dVar9;
  int in_stack_00000010;
  CallInfo local_30;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_30 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x4a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00bd4bb4;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_30,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_30 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x4d,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00bd4bb4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if ((callInfo_local._0_4_ & 0xfffffe) == 0) {
    pvVar8 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             nan.ptr;
  }
  else {
    pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    bVar4 = TaggedInt::Is(pvVar7);
    if (bVar4) {
      uVar5 = TaggedInt::ToInt32(pvVar7);
      uVar3 = -uVar5;
      if (0 < (int)uVar5) {
        uVar3 = uVar5;
      }
      pvVar8 = JavascriptNumber::ToVar((ulong)uVar3,pSVar1);
    }
    else {
      pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      dVar9 = JavascriptConversion::ToNumber(pvVar7,pSVar1);
      dVar9 = Abs(dVar9);
      pvVar8 = JavascriptNumber::ToVarNoCheck(dVar9,pSVar1);
    }
  }
  return pvVar8;
}

Assistant:

Var Math::Abs(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count >= 2)
        {
            Var arg = args[1];

            if (TaggedInt::Is(arg))
            {
#if defined(TARGET_64)
                __int64 result = ::_abs64(TaggedInt::ToInt32(arg));
#else
                __int32 result = ::abs(TaggedInt::ToInt32(arg));
#endif
                return JavascriptNumber::ToVar(result, scriptContext);
            }

            double x = JavascriptConversion::ToNumber(args[1], scriptContext);

            double result = Math::Abs(x);
            return JavascriptNumber::ToVarNoCheck(result, scriptContext);
        }
        else
        {
            return scriptContext->GetLibrary()->GetNaN();
        }
    }